

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256.h
# Opt level: O3

optional<uint256> *
detail::FromUserHex<uint256>(optional<uint256> *__return_storage_ptr__,string_view input)

{
  short sVar1;
  char *in_RCX;
  short *__src;
  detail *this;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string padded;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  __src = (short *)input._M_str;
  this = (detail *)input._M_len;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((detail *)0x1 < this) {
    sVar1 = *__src;
    in_RCX = (char *)(ulong)(sVar1 == 0x7830);
    if (sVar1 == 0x7830) {
      this = this + -2;
    }
    __src = __src + (long)in_RCX;
    if ((detail *)0x3f < this) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        str_00._M_str._0_1_ = sVar1 == 0x7830;
        str_00._M_len = (size_t)__src;
        str_00._M_str._1_7_ = 0;
        FromHex<uint256>(__return_storage_ptr__,this,str_00);
        return __return_storage_ptr__;
      }
      goto LAB_006dc4a8;
    }
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_48,0x40,'0');
  if (this != (detail *)0x0) {
    memmove(local_48._M_dataplus._M_p + (0x40 - (long)this),__src,(size_t)this);
  }
  str._M_str = in_RCX;
  str._M_len = (size_t)local_48._M_dataplus._M_p;
  FromHex<uint256>(__return_storage_ptr__,(detail *)local_48._M_string_length,str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_006dc4a8:
  __stack_chk_fail();
}

Assistant:

std::optional<uintN_t> FromUserHex(std::string_view input)
{
    input = util::RemovePrefixView(input, "0x");
    constexpr auto expected_size{uintN_t::size() * 2};
    if (input.size() < expected_size) {
        auto padded = std::string(expected_size, '0');
        std::copy(input.begin(), input.end(), padded.begin() + expected_size - input.size());
        return FromHex<uintN_t>(padded);
    }
    return FromHex<uintN_t>(input);
}